

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  puVar2 = (uint *)malloc(numcodes * 4);
  tree->lengths = puVar2;
  if (puVar2 != (uint *)0x0) {
    for (uVar1 = 0; uVar3 = (ulong)uVar1, uVar3 != numcodes; uVar1 = uVar1 + 1) {
      tree->lengths[uVar3] = bitlen[uVar3];
    }
    tree->numcodes = (uint)numcodes;
    tree->maxbitlen = maxbitlen;
    uVar1 = HuffmanTree_makeFromLengths2(tree);
    return uVar1;
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
	size_t numcodes, unsigned maxbitlen)
{
	unsigned i;
	tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
	if (!tree->lengths) return 83; /*alloc fail*/
	for (i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
	tree->numcodes = (unsigned)numcodes; /*number of symbols*/
	tree->maxbitlen = maxbitlen;
	return HuffmanTree_makeFromLengths2(tree);
}